

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddCustomCommandToTarget
          (cmMakefile *this,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,CustomCommandType type,char *comment,
          char *workingDir,bool escapeOldStyle,bool uses_terminal,string *depfile,
          bool command_expand_lists,ObjectLibraryCommands objLibraryCommands)

{
  pointer pbVar1;
  PolicyStatus PVar2;
  iterator iVar3;
  ostream *poVar4;
  cmSourceFile *this_00;
  cmTarget *pcVar5;
  PolicyID id;
  MessageType t;
  char *pcVar6;
  pointer sourceName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_output;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  cmCustomCommand cc;
  
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,target);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
    PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0040,false);
    if (PVar2 - NEW < 3) {
      t = FATAL_ERROR;
    }
    else {
      if (PVar2 != WARN) goto LAB_0019881d;
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&no_output,(cmPolicies *)0x28,id);
      poVar4 = std::operator<<((ostream *)&cc,(string *)&no_output);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&no_output);
      t = AUTHOR_WARNING;
    }
    pcVar5 = FindTargetToUse(this,target,false);
    if (pcVar5 == (cmTarget *)0x0) {
      poVar4 = std::operator<<((ostream *)&cc,"No TARGET \'");
      poVar4 = std::operator<<(poVar4,(string *)target);
      pcVar6 = "\' has been created in this directory.";
    }
    else if (pcVar5->IsImportedTarget == true) {
      poVar4 = std::operator<<((ostream *)&cc,"TARGET \'");
      poVar4 = std::operator<<(poVar4,(string *)target);
      pcVar6 = "\' is IMPORTED and does not build here.";
    }
    else {
      poVar4 = std::operator<<((ostream *)&cc,"TARGET \'");
      poVar4 = std::operator<<(poVar4,(string *)target);
      pcVar6 = "\' was not created in this directory.";
    }
    std::operator<<(poVar4,pcVar6);
    std::__cxx11::stringbuf::str();
    IssueMessage(this,t,(string *)&no_output);
    std::__cxx11::string::~string((string *)&no_output);
  }
  else {
    if (*(int *)((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                       ._M_cur + 0x1d0) == 4 && objLibraryCommands == RejectObjectLibraryCommands) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
      poVar4 = std::operator<<((ostream *)&cc,"Target \"");
      poVar4 = std::operator<<(poVar4,(string *)target);
      std::operator<<(poVar4,
                      "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,(string *)&no_output);
    }
    else {
      if (*(int *)((long)iVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                         ._M_cur + 0x1d0) != 7) {
        pbVar1 = (byproducts->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (sourceName = (byproducts->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start; sourceName != pbVar1;
            sourceName = sourceName + 1) {
          this_00 = GetOrCreateSource(this,sourceName,true,Ambiguous);
          if (this_00 != (cmSourceFile *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cc,"GENERATED",(allocator<char> *)&no_output);
            cmSourceFile::SetProperty(this_00,(string *)&cc,"1");
            std::__cxx11::string::~string((string *)&cc);
          }
        }
        no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        no_output.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,&no_output);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1d8,byproducts);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1f0,depends);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                  (&local_208,
                   &commandLines->
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        cmCustomCommand::cmCustomCommand
                  (&cc,this,&local_1c0,&local_1d8,&local_1f0,(cmCustomCommandLines *)&local_208,
                   comment,workingDir);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_208);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        cmCustomCommand::SetEscapeOldStyle(&cc,escapeOldStyle);
        cmCustomCommand::SetEscapeAllowMakeVars(&cc,true);
        cmCustomCommand::SetUsesTerminal(&cc,uses_terminal);
        cmCustomCommand::SetCommandExpandLists(&cc,command_expand_lists);
        cmCustomCommand::SetDepfile(&cc,depfile);
        if (type < (POST_BUILD|PRE_LINK)) {
          std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::push_back
                    ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
                     ((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                            ._M_cur + (ulong)(type * 0x18) + 0x148),&cc);
        }
        cmCustomCommand::~cmCustomCommand(&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&no_output);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cc);
      poVar4 = std::operator<<((ostream *)&cc,"Target \"");
      poVar4 = std::operator<<(poVar4,(string *)target);
      std::operator<<(poVar4,
                      "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,(string *)&no_output);
    }
    std::__cxx11::string::~string((string *)&no_output);
  }
LAB_0019881d:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cc);
  return;
}

Assistant:

void cmMakefile::AddCustomCommandToTarget(
  const std::string& target, const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, cmTarget::CustomCommandType type,
  const char* comment, const char* workingDir, bool escapeOldStyle,
  bool uses_terminal, const std::string& depfile, bool command_expand_lists,
  ObjectLibraryCommands objLibraryCommands)
{
  // Find the target to which to add the custom command.
  cmTargets::iterator ti = this->Targets.find(target);

  if (ti == this->Targets.end()) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      IssueMessage(messageType, e.str());
    }

    return;
  }

  cmTarget& t = ti->second;
  if (objLibraryCommands == RejectObjectLibraryCommands &&
      t.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  // Always create the byproduct sources and mark them generated.
  for (std::string const& o : byproducts) {
    if (cmSourceFile* out = this->GetOrCreateSource(o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Add the command to the appropriate build step for the target.
  std::vector<std::string> no_output;
  cmCustomCommand cc(this, no_output, byproducts, depends, commandLines,
                     comment, workingDir);
  cc.SetEscapeOldStyle(escapeOldStyle);
  cc.SetEscapeAllowMakeVars(true);
  cc.SetUsesTerminal(uses_terminal);
  cc.SetCommandExpandLists(command_expand_lists);
  cc.SetDepfile(depfile);
  switch (type) {
    case cmTarget::PRE_BUILD:
      t.AddPreBuildCommand(cc);
      break;
    case cmTarget::PRE_LINK:
      t.AddPreLinkCommand(cc);
      break;
    case cmTarget::POST_BUILD:
      t.AddPostBuildCommand(cc);
      break;
  }
}